

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

bool DoDehPatch(void)

{
  char *mode;
  bool bVar1;
  int iVar2;
  int local_14;
  int local_10;
  int i;
  int cont;
  
  if (!batchrun) {
    Printf("Adding dehacked patch %s\n",PatchName);
  }
  pversion = -1;
  dversion = -1;
  iVar2 = strncmp(PatchFile,"Patch File for DeHackEd v",0x19);
  if (iVar2 == 0) {
    if (((PatchFile[0x19] < '3') && (PatchFile[0x19] != '2')) && (PatchFile[0x1b] != '3')) {
      Printf(200,"\"%s\" is an old and unsupported DeHackEd patch\n",PatchName);
      if (PatchName != (char *)0x0) {
        operator_delete__(PatchName);
      }
      if (PatchFile != (char *)0x0) {
        operator_delete__(PatchFile);
      }
      return false;
    }
    for (local_14 = 0; local_14 < PatchSize; local_14 = local_14 + 1) {
      if (PatchFile[local_14] == '\0') {
        PatchFile[local_14] = ' ';
      }
    }
    PatchPt = strchr(PatchFile,10);
    while (local_10 = GetLine(), local_10 == 1) {
      iVar2 = strcasecmp(Line1,"Doom version");
      if (iVar2 == 0) {
        dversion = atoi(Line2);
      }
      else {
        iVar2 = strcasecmp(Line1,"Patch format");
        if (iVar2 == 0) {
          pversion = atoi(Line2);
        }
      }
    }
    if (((local_10 == 0) || (dversion == -1)) || (pversion == -1)) {
      if (PatchName != (char *)0x0) {
        operator_delete__(PatchName);
      }
      if (PatchFile != (char *)0x0) {
        operator_delete__(PatchFile);
      }
      Printf(200,"\"%s\" is not a DeHackEd patch file\n",PatchFile);
      return false;
    }
  }
  else {
    DPrintf(2,"Patch does not have DeHackEd signature. Assuming .bex\n");
    dversion = 0x13;
    pversion = 6;
    PatchPt = PatchFile;
    do {
      local_10 = GetLine();
    } while (local_10 == 1);
  }
  if ((pversion != 5) && (pversion != 6)) {
    Printf("DeHackEd patch version is %d.\nUnexpected results may occur.\n",(ulong)(uint)pversion);
  }
  if (dversion == 0x10) {
    dversion = 0;
  }
  else if (dversion == 0x11) {
    dversion = 2;
  }
  else if (dversion == 0x13) {
    dversion = 3;
  }
  else if (dversion == 0x14) {
    dversion = 1;
  }
  else if (dversion == 0x15) {
    dversion = 4;
  }
  else {
    Printf("Patch created with unknown DOOM version.\nAssuming version 1.9.\n");
    dversion = 3;
  }
  bVar1 = LoadDehSupp();
  if (bVar1) {
    do {
      mode = Line1;
      if (local_10 == 1) {
        Printf("Key %s encountered out of context\n",Line1);
        local_10 = 0;
      }
      else if (local_10 == 2) {
        iVar2 = atoi(Line2);
        local_10 = HandleMode(mode,iVar2);
      }
    } while (local_10 != 0);
    UnloadDehSupp();
    if (PatchName != (char *)0x0) {
      operator_delete__(PatchName);
    }
    if (PatchFile != (char *)0x0) {
      operator_delete__(PatchFile);
    }
    if ((batchrun & 1U) == 0) {
      Printf("Patch installed\n");
    }
    i._3_1_ = true;
  }
  else {
    Printf("Could not load DEH support data\n");
    UnloadDehSupp();
    if (PatchName != (char *)0x0) {
      operator_delete__(PatchName);
    }
    if (PatchFile != (char *)0x0) {
      operator_delete__(PatchFile);
    }
    i._3_1_ = false;
  }
  return i._3_1_;
}

Assistant:

static bool DoDehPatch()
{
	if (!batchrun) Printf("Adding dehacked patch %s\n", PatchName);

	int cont;

	dversion = pversion = -1;
	cont = 0;
	if (0 == strncmp (PatchFile, "Patch File for DeHackEd v", 25))
	{
		if (PatchFile[25] < '3' && PatchFile[25] != '2' && PatchFile[27] != '3')
		{
			Printf (PRINT_BOLD, "\"%s\" is an old and unsupported DeHackEd patch\n", PatchName);
			delete[] PatchName;
			delete[] PatchFile;
			return false;
		}
		// fix for broken WolfenDoom patches which contain \0 characters in some places.
		for (int i = 0; i < PatchSize; i++)
		{
			if (PatchFile[i] == 0) PatchFile[i] = ' ';	
		}

		PatchPt = strchr (PatchFile, '\n');
		while ((cont = GetLine()) == 1)
		{
				 CHECKKEY ("Doom version", dversion)
			else CHECKKEY ("Patch format", pversion)
		}
		if (!cont || dversion == -1 || pversion == -1)
		{
			delete[] PatchName;
			delete[] PatchFile;
			Printf (PRINT_BOLD, "\"%s\" is not a DeHackEd patch file\n", PatchFile);
			return false;
		}
	}
	else
	{
		DPrintf (DMSG_WARNING, "Patch does not have DeHackEd signature. Assuming .bex\n");
		dversion = 19;
		pversion = 6;
		PatchPt = PatchFile;
		while ((cont = GetLine()) == 1)
		{}
	}

	if (pversion != 5 && pversion != 6)
	{
		Printf ("DeHackEd patch version is %d.\nUnexpected results may occur.\n", pversion);
	}

	if (dversion == 16)
		dversion = 0;
	else if (dversion == 17)
		dversion = 2;
	else if (dversion == 19)
		dversion = 3;
	else if (dversion == 20)
		dversion = 1;
	else if (dversion == 21)
		dversion = 4;
	else
	{
		Printf ("Patch created with unknown DOOM version.\nAssuming version 1.9.\n");
		dversion = 3;
	}

	if (!LoadDehSupp ())
	{
		Printf ("Could not load DEH support data\n");
		UnloadDehSupp ();
		delete[] PatchName;
		delete[] PatchFile;
		return false;
	}

	do
	{
		if (cont == 1)
		{
			Printf ("Key %s encountered out of context\n", Line1);
			cont = 0;
		}
		else if (cont == 2)
		{
			cont = HandleMode (Line1, atoi (Line2));
		}
	} while (cont);

	UnloadDehSupp ();
	delete[] PatchName;
	delete[] PatchFile;
	if (!batchrun) Printf ("Patch installed\n");
	return true;
}